

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

void GD::print_lda_features(vw *all,example *ec)

{
  features *pfVar1;
  byte bVar2;
  byte *pbVar3;
  element_type *peVar4;
  uint32_t *puVar5;
  ostream *poVar6;
  weight *pwVar7;
  byte *pbVar8;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar9;
  byte *pbVar10;
  float *pfVar11;
  ulong uVar12;
  ulong *puVar13;
  char local_7d [5];
  features *local_78;
  long local_70;
  byte *local_68;
  byte *local_60;
  ulong local_58;
  float *local_50;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  float *local_40;
  sparse_parameters *local_38;
  
  puVar5 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar5 = &(all->weights).sparse_weights._stride_shift;
  }
  pfVar1 = (ec->super_example_predict).feature_space;
  pbVar3 = (ec->super_example_predict).indices._end;
  local_70 = 0;
  pbVar10 = (ec->super_example_predict).indices._begin;
  for (pbVar8 = pbVar10; pbVar8 != pbVar3; pbVar8 = pbVar8 + 1) {
    local_70 = local_70 +
               ((long)(ec->super_example_predict).feature_space[*pbVar8].values._end -
                (long)pfVar1[*pbVar8].values._begin >> 2);
  }
  if (pbVar10 != pbVar3) {
    local_58 = (ulong)*puVar5;
    local_38 = &(all->weights).sparse_weights;
    local_78 = pfVar1;
    local_68 = pbVar3;
    do {
      bVar2 = *pbVar10;
      pfVar11 = local_78[bVar2].values._begin;
      local_50 = local_78[bVar2].values._end;
      local_60 = pbVar10;
      if (pfVar11 != local_50) {
        puVar13 = local_78[bVar2].indicies._begin;
        psVar9 = local_78[bVar2].space_names._begin;
        do {
          local_7d[0] = '\t';
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_7d,1);
          peVar4 = (psVar9->
                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(peVar4->first)._M_dataplus._M_p,
                              (peVar4->first)._M_string_length);
          local_7d[1] = 0x5e;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_7d + 1,1);
          peVar4 = (psVar9->
                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          local_48 = psVar9;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(peVar4->second)._M_dataplus._M_p,
                              (peVar4->second)._M_string_length);
          local_7d[2] = 0x3a;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_7d + 2,1);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          local_7d[3] = 0x3a;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_7d + 3,1);
          local_40 = pfVar11;
          std::ostream::_M_insert<double>((double)*pfVar11);
          if (all->lda != 0) {
            uVar12 = 0;
            do {
              local_7d[4] = 0x3a;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_7d + 4,1);
              if ((all->weights).sparse == true) {
                pwVar7 = sparse_parameters::operator[](local_38,*puVar13);
              }
              else {
                pwVar7 = (all->weights).dense_weights._begin +
                         (*puVar13 & (all->weights).dense_weights._weight_mask);
              }
              std::ostream::_M_insert<double>((double)pwVar7[uVar12]);
              uVar12 = uVar12 + 1;
            } while (uVar12 < all->lda);
          }
          pfVar11 = local_40 + 1;
          puVar13 = puVar13 + 1;
          psVar9 = local_48 + 1;
        } while (pfVar11 != local_50);
      }
      pbVar10 = local_60 + 1;
    } while (pbVar10 != local_68);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," total of ",10);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," features.",10);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return;
}

Assistant:

void print_lda_features(vw& all, example& ec)
{
  parameters& weights = all.weights;
  uint32_t stride_shift = weights.stride_shift();
  size_t count = 0;
  for (features& fs : ec) count += fs.size();
  for (features& fs : ec)
  {
    for (features::iterator_all& f : fs.values_indices_audit())
    {
      cout << '\t' << f.audit().get()->first << '^' << f.audit().get()->second << ':'
           << ((f.index() >> stride_shift) & all.parse_mask) << ':' << f.value();
      for (size_t k = 0; k < all.lda; k++) cout << ':' << (&weights[f.index()])[k];
    }
  }
  cout << " total of " << count << " features." << endl;
}